

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

int __thiscall efsw::String::compare(String *this,char *s)

{
  int iVar1;
  String local_38;
  char *local_18;
  char *s_local;
  String *this_local;
  
  local_18 = s;
  s_local = (char *)this;
  String(&local_38,s);
  iVar1 = compare(this,&local_38);
  ~String(&local_38);
  return iVar1;
}

Assistant:

int String::compare( const char* s ) const {
	return compare( String( s ) );
}